

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O2

void __thiscall cxxpool::thread_pool::thread_pool(thread_pool *this,size_t n_threads)

{
  pointer ptVar1;
  pointer ptVar2;
  long lVar3;
  code *local_60;
  undefined8 local_58;
  thread_pool *local_50;
  thread local_48;
  pthread_mutex_t *local_40;
  thread local_38;
  thread thread;
  
  thread_pool(this);
  if (n_threads != 0) {
    local_40 = (pthread_mutex_t *)&this->thread_mutex_;
    std::mutex::lock((mutex *)&local_40->__data);
    ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar3 = (long)ptVar1 - (long)ptVar2;
    while ((ulong)((long)ptVar1 - (long)ptVar2 >> 3) < (lVar3 >> 3) + n_threads) {
      local_38._M_id._M_thread = (id)0;
      local_60 = worker;
      local_58 = 0;
      local_50 = this;
      std::thread::thread<void(cxxpool::thread_pool::*)(),cxxpool::thread_pool*,void>
                (&local_48,(type *)&local_60,&local_50);
      if (local_38._M_id._M_thread != 0) {
        std::terminate();
      }
      local_38._M_id._M_thread = local_48._M_id._M_thread;
      local_48._M_id._M_thread = (id)0;
      std::thread::~thread(&local_48);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->threads_,&local_38);
      std::thread::~thread(&local_38);
      ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    pthread_mutex_unlock(local_40);
  }
  return;
}

Assistant:

explicit thread_pool(std::size_t n_threads)
    : thread_pool{}
    {
        if (n_threads > 0) {
            std::lock_guard<std::mutex> thread_lock(thread_mutex_);
            const auto n_target = threads_.size() + n_threads;
            while (threads_.size() < n_target) {
                std::thread thread;
                try {
                    thread = std::thread{&thread_pool::worker, this};
                } catch (...) {
                    shutdown();
                    throw;
                }
                try {
                    threads_.push_back(std::move(thread));
                } catch (...) {
                    shutdown();
                    thread.join();
                    throw;
                }
            }
        }
    }